

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hdecompress.c
# Opt level: O0

void qtree_bitins64(uchar *a,int nx,int ny,LONGLONG *b,int n,int bit)

{
  ulong uVar1;
  int iVar2;
  LONGLONG plane_val;
  int s00;
  int k;
  int j;
  int i;
  int bit_local;
  int n_local;
  LONGLONG *b_local;
  int ny_local;
  int nx_local;
  uchar *a_local;
  
  uVar1 = 1L << ((byte)bit & 0x3f);
  plane_val._4_4_ = 0;
  for (k = 0; k < nx + -1; k = k + 2) {
    plane_val._0_4_ = n * k;
    for (s00 = 0; s00 < ny + -1; s00 = s00 + 2) {
      switch(a[plane_val._4_4_]) {
      case '\0':
        break;
      case '\x01':
        iVar2 = (int)plane_val + n + 1;
        b[iVar2] = uVar1 | b[iVar2];
        break;
      case '\x02':
        b[(int)plane_val + n] = uVar1 | b[(int)plane_val + n];
        break;
      case '\x03':
        iVar2 = (int)plane_val + n + 1;
        b[iVar2] = uVar1 | b[iVar2];
        b[(int)plane_val + n] = uVar1 | b[(int)plane_val + n];
        break;
      case '\x04':
        b[(int)plane_val + 1] = uVar1 | b[(int)plane_val + 1];
        break;
      case '\x05':
        iVar2 = (int)plane_val + n + 1;
        b[iVar2] = uVar1 | b[iVar2];
        b[(int)plane_val + 1] = uVar1 | b[(int)plane_val + 1];
        break;
      case '\x06':
        b[(int)plane_val + n] = uVar1 | b[(int)plane_val + n];
        b[(int)plane_val + 1] = uVar1 | b[(int)plane_val + 1];
        break;
      case '\a':
        iVar2 = (int)plane_val + n + 1;
        b[iVar2] = uVar1 | b[iVar2];
        b[(int)plane_val + n] = uVar1 | b[(int)plane_val + n];
        b[(int)plane_val + 1] = uVar1 | b[(int)plane_val + 1];
        break;
      case '\b':
        b[(int)plane_val] = uVar1 | b[(int)plane_val];
        break;
      case '\t':
        iVar2 = (int)plane_val + n + 1;
        b[iVar2] = uVar1 | b[iVar2];
        b[(int)plane_val] = uVar1 | b[(int)plane_val];
        break;
      case '\n':
        b[(int)plane_val + n] = uVar1 | b[(int)plane_val + n];
        b[(int)plane_val] = uVar1 | b[(int)plane_val];
        break;
      case '\v':
        iVar2 = (int)plane_val + n + 1;
        b[iVar2] = uVar1 | b[iVar2];
        b[(int)plane_val + n] = uVar1 | b[(int)plane_val + n];
        b[(int)plane_val] = uVar1 | b[(int)plane_val];
        break;
      case '\f':
        b[(int)plane_val + 1] = uVar1 | b[(int)plane_val + 1];
        b[(int)plane_val] = uVar1 | b[(int)plane_val];
        break;
      case '\r':
        iVar2 = (int)plane_val + n + 1;
        b[iVar2] = uVar1 | b[iVar2];
        b[(int)plane_val + 1] = uVar1 | b[(int)plane_val + 1];
        b[(int)plane_val] = uVar1 | b[(int)plane_val];
        break;
      case '\x0e':
        b[(int)plane_val + n] = uVar1 | b[(int)plane_val + n];
        b[(int)plane_val + 1] = uVar1 | b[(int)plane_val + 1];
        b[(int)plane_val] = uVar1 | b[(int)plane_val];
        break;
      case '\x0f':
        iVar2 = (int)plane_val + n + 1;
        b[iVar2] = uVar1 | b[iVar2];
        b[(int)plane_val + n] = uVar1 | b[(int)plane_val + n];
        b[(int)plane_val + 1] = uVar1 | b[(int)plane_val + 1];
        b[(int)plane_val] = uVar1 | b[(int)plane_val];
      }
      plane_val._0_4_ = (int)plane_val + 2;
      plane_val._4_4_ = plane_val._4_4_ + 1;
    }
    if (s00 < ny) {
      switch(a[plane_val._4_4_]) {
      case '\0':
        break;
      case '\x01':
        break;
      case '\x02':
        b[(int)plane_val + n] = uVar1 | b[(int)plane_val + n];
        break;
      case '\x03':
        b[(int)plane_val + n] = uVar1 | b[(int)plane_val + n];
        break;
      case '\x04':
        break;
      case '\x05':
        break;
      case '\x06':
        b[(int)plane_val + n] = uVar1 | b[(int)plane_val + n];
        break;
      case '\a':
        b[(int)plane_val + n] = uVar1 | b[(int)plane_val + n];
        break;
      case '\b':
        b[(int)plane_val] = uVar1 | b[(int)plane_val];
        break;
      case '\t':
        b[(int)plane_val] = uVar1 | b[(int)plane_val];
        break;
      case '\n':
        b[(int)plane_val + n] = uVar1 | b[(int)plane_val + n];
        b[(int)plane_val] = uVar1 | b[(int)plane_val];
        break;
      case '\v':
        b[(int)plane_val + n] = uVar1 | b[(int)plane_val + n];
        b[(int)plane_val] = uVar1 | b[(int)plane_val];
        break;
      case '\f':
        b[(int)plane_val] = uVar1 | b[(int)plane_val];
        break;
      case '\r':
        b[(int)plane_val] = uVar1 | b[(int)plane_val];
        break;
      case '\x0e':
        b[(int)plane_val + n] = uVar1 | b[(int)plane_val + n];
        b[(int)plane_val] = uVar1 | b[(int)plane_val];
        break;
      case '\x0f':
        b[(int)plane_val + n] = uVar1 | b[(int)plane_val + n];
        b[(int)plane_val] = uVar1 | b[(int)plane_val];
      }
      plane_val._4_4_ = plane_val._4_4_ + 1;
    }
  }
  if (k < nx) {
    plane_val._0_4_ = n * k;
    for (s00 = 0; s00 < ny + -1; s00 = s00 + 2) {
      switch(a[plane_val._4_4_]) {
      case '\0':
        break;
      case '\x01':
        break;
      case '\x02':
        break;
      case '\x03':
        break;
      case '\x04':
        b[(int)plane_val + 1] = uVar1 | b[(int)plane_val + 1];
        break;
      case '\x05':
        b[(int)plane_val + 1] = uVar1 | b[(int)plane_val + 1];
        break;
      case '\x06':
        b[(int)plane_val + 1] = uVar1 | b[(int)plane_val + 1];
        break;
      case '\a':
        b[(int)plane_val + 1] = uVar1 | b[(int)plane_val + 1];
        break;
      case '\b':
        b[(int)plane_val] = uVar1 | b[(int)plane_val];
        break;
      case '\t':
        b[(int)plane_val] = uVar1 | b[(int)plane_val];
        break;
      case '\n':
        b[(int)plane_val] = uVar1 | b[(int)plane_val];
        break;
      case '\v':
        b[(int)plane_val] = uVar1 | b[(int)plane_val];
        break;
      case '\f':
        b[(int)plane_val + 1] = uVar1 | b[(int)plane_val + 1];
        b[(int)plane_val] = uVar1 | b[(int)plane_val];
        break;
      case '\r':
        b[(int)plane_val + 1] = uVar1 | b[(int)plane_val + 1];
        b[(int)plane_val] = uVar1 | b[(int)plane_val];
        break;
      case '\x0e':
        b[(int)plane_val + 1] = uVar1 | b[(int)plane_val + 1];
        b[(int)plane_val] = uVar1 | b[(int)plane_val];
        break;
      case '\x0f':
        b[(int)plane_val + 1] = uVar1 | b[(int)plane_val + 1];
        b[(int)plane_val] = uVar1 | b[(int)plane_val];
      }
      plane_val._0_4_ = (int)plane_val + 2;
      plane_val._4_4_ = plane_val._4_4_ + 1;
    }
    if (s00 < ny) {
      switch(a[plane_val._4_4_]) {
      case '\0':
        break;
      case '\x01':
        break;
      case '\x02':
        break;
      case '\x03':
        break;
      case '\x04':
        break;
      case '\x05':
        break;
      case '\x06':
        break;
      case '\a':
        break;
      case '\b':
        b[(int)plane_val] = uVar1 | b[(int)plane_val];
        break;
      case '\t':
        b[(int)plane_val] = uVar1 | b[(int)plane_val];
        break;
      case '\n':
        b[(int)plane_val] = uVar1 | b[(int)plane_val];
        break;
      case '\v':
        b[(int)plane_val] = uVar1 | b[(int)plane_val];
        break;
      case '\f':
        b[(int)plane_val] = uVar1 | b[(int)plane_val];
        break;
      case '\r':
        b[(int)plane_val] = uVar1 | b[(int)plane_val];
        break;
      case '\x0e':
        b[(int)plane_val] = uVar1 | b[(int)plane_val];
        break;
      case '\x0f':
        b[(int)plane_val] = uVar1 | b[(int)plane_val];
      }
    }
  }
  return;
}

Assistant:

static void
qtree_bitins64(unsigned char a[], int nx, int ny, LONGLONG b[], int n, int bit)
/*
   int n;		declared y dimension of b
*/
{
int i, j, k;
int s00;
LONGLONG plane_val;

	plane_val = ((LONGLONG) 1) << bit;

	/*
	 * expand each 2x2 block
	 */
	k = 0;							/* k   is index of a[i/2,j/2]	*/
	for (i = 0; i<nx-1; i += 2) {
		s00 = n*i;					/* s00 is index of b[i,j]		*/

  /* Note:
     this code appears to run very slightly faster on a 32-bit linux
     machine using s00+n rather than the s10 intermediate variable
  */
  /*		s10 = s00+n;	*/			/* s10 is index of b[i+1,j]	*/
		for (j = 0; j<ny-1; j += 2) {

		    switch (a[k]) {
		    case(0):
			break;
		    case(1):
			b[s00+n+1] |= plane_val;
			break;
		    case(2):
			b[s00+n  ] |= plane_val;
			break;
		    case(3):
			b[s00+n+1] |= plane_val;
			b[s00+n  ] |= plane_val;
			break;
		    case(4):
			b[s00+1] |= plane_val;
			break;
		    case(5):
			b[s00+n+1] |= plane_val;
			b[s00+1] |= plane_val;
			break;
		    case(6):
			b[s00+n  ] |= plane_val;
			b[s00+1] |= plane_val;
			break;
		    case(7):
			b[s00+n+1] |= plane_val;
			b[s00+n  ] |= plane_val;
			b[s00+1] |= plane_val;
			break;
		    case(8):
			b[s00  ] |= plane_val;
			break;
		    case(9):
			b[s00+n+1] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(10):
			b[s00+n  ] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(11):
			b[s00+n+1] |= plane_val;
			b[s00+n  ] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(12):
			b[s00+1] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(13):
			b[s00+n+1] |= plane_val;
			b[s00+1] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(14):
			b[s00+n  ] |= plane_val;
			b[s00+1] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(15):
			b[s00+n+1] |= plane_val;
			b[s00+n  ] |= plane_val;
			b[s00+1] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    }

/*
			b[s10+1] |= ((LONGLONG) ( a[k]     & 1)) << bit;
			b[s10  ] |= ((((LONGLONG)a[k])>>1) & 1) << bit;
			b[s00+1] |= ((((LONGLONG)a[k])>>2) & 1) << bit;
			b[s00  ] |= ((((LONGLONG)a[k])>>3) & 1) << bit;
*/
			s00 += 2;
/*			s10 += 2;  */
			k += 1;
		}
		if (j < ny) {
			/*
			 * row size is odd, do last element in row
			 * s00+1, s10+1 are off edge
			 */

		    switch (a[k]) {
		    case(0):
			break;
		    case(1):
			break;
		    case(2):
			b[s00+n  ] |= plane_val;
			break;
		    case(3):
			b[s00+n  ] |= plane_val;
			break;
		    case(4):
			break;
		    case(5):
			break;
		    case(6):
			b[s00+n  ] |= plane_val;
			break;
		    case(7):
			b[s00+n  ] |= plane_val;
			break;
		    case(8):
			b[s00  ] |= plane_val;
			break;
		    case(9):
			b[s00  ] |= plane_val;
			break;
		    case(10):
			b[s00+n  ] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(11):
			b[s00+n  ] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(12):
			b[s00  ] |= plane_val;
			break;
		    case(13):
			b[s00  ] |= plane_val;
			break;
		    case(14):
			b[s00+n  ] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(15):
			b[s00+n  ] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    }
/*
			b[s10  ] |= ((((LONGLONG)a[k])>>1) & 1) << bit;
			b[s00  ] |= ((((LONGLONG)a[k])>>3) & 1) << bit;
*/
			k += 1;
		}
	}
	if (i < nx) {
		/*
		 * column size is odd, do last row
		 * s10, s10+1 are off edge
		 */
		s00 = n*i;
		for (j = 0; j<ny-1; j += 2) {

		    switch (a[k]) {
		    case(0):
			break;
		    case(1):
			break;
		    case(2):
			break;
		    case(3):
			break;
		    case(4):
			b[s00+1] |= plane_val;
			break;
		    case(5):
			b[s00+1] |= plane_val;
			break;
		    case(6):
			b[s00+1] |= plane_val;
			break;
		    case(7):
			b[s00+1] |= plane_val;
			break;
		    case(8):
			b[s00  ] |= plane_val;
			break;
		    case(9):
			b[s00  ] |= plane_val;
			break;
		    case(10):
			b[s00  ] |= plane_val;
			break;
		    case(11):
			b[s00  ] |= plane_val;
			break;
		    case(12):
			b[s00+1] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(13):
			b[s00+1] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(14):
			b[s00+1] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(15):
			b[s00+1] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    }

/*
			b[s00+1] |= ((((LONGLONG)a[k])>>2) & 1) << bit;
			b[s00  ] |= ((((LONGLONG)a[k])>>3) & 1) << bit;
*/
			s00 += 2;
			k += 1;
		}
		if (j < ny) {
			/*
			 * both row and column size are odd, do corner element
			 * s00+1, s10, s10+1 are off edge
			 */

		    switch (a[k]) {
		    case(0):
			break;
		    case(1):
			break;
		    case(2):
			break;
		    case(3):
			break;
		    case(4):
			break;
		    case(5):
			break;
		    case(6):
			break;
		    case(7):
			break;
		    case(8):
			b[s00  ] |= plane_val;
			break;
		    case(9):
			b[s00  ] |= plane_val;
			break;
		    case(10):
			b[s00  ] |= plane_val;
			break;
		    case(11):
			b[s00  ] |= plane_val;
			break;
		    case(12):
			b[s00  ] |= plane_val;
			break;
		    case(13):
			b[s00  ] |= plane_val;
			break;
		    case(14):
			b[s00  ] |= plane_val;
			break;
		    case(15):
			b[s00  ] |= plane_val;
			break;
		    }
/*
			b[s00  ] |= ((((LONGLONG)a[k])>>3) & 1) << bit;
*/
			k += 1;
		}
	}
}